

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::BetweenExpression::Deserialize(BetweenExpression *this,Deserializer *deserializer)

{
  BetweenExpression *this_00;
  pointer pBVar1;
  _Head_base<0UL,_duckdb::BetweenExpression_*,_false> local_20;
  
  this_00 = (BetweenExpression *)operator_new(0x50);
  BetweenExpression(this_00);
  local_20._M_head_impl = this_00;
  pBVar1 = unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,200,"input",&pBVar1->input);
  pBVar1 = unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xc9,"lower",&pBVar1->lower);
  pBVar1 = unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xca,"upper",&pBVar1->upper);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> BetweenExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BetweenExpression>(new BetweenExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "input", result->input);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(201, "lower", result->lower);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "upper", result->upper);
	return std::move(result);
}